

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O2

char * bssl::anon_unknown_0::LevelToString(ssl_encryption_level_t level)

{
  if (level < 4) {
    return &DAT_002f3dfc + *(int *)(&DAT_002f3dfc + (ulong)level * 4);
  }
  return "<unknown>";
}

Assistant:

const char *LevelToString(ssl_encryption_level_t level) {
  switch (level) {
    case ssl_encryption_initial:
      return "initial";
    case ssl_encryption_early_data:
      return "early data";
    case ssl_encryption_handshake:
      return "handshake";
    case ssl_encryption_application:
      return "application";
  }
  return "<unknown>";
}